

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightHandle
pbrt::LightHandle::CreateArea
          (string *name,ParameterDictionary *parameters,Transform *renderFromLight,
          MediumInterface *mediumInterface,ShapeHandle *shape,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  MediumHandle *in_RCX;
  ParameterDictionary *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  in_stack_00000010;
  LightHandle *area;
  ParameterDictionary *in_stack_00000140;
  FileLoc *in_stack_00000958;
  RGBColorSpace *in_stack_00000960;
  ParameterDictionary *in_stack_00000968;
  MediumHandle *in_stack_00000970;
  Transform *in_stack_00000978;
  Allocator in_stack_00000980;
  ShapeHandle *in_stack_00000990;
  MediumHandle *in_stack_ffffffffffffff68;
  DiffuseAreaLight *pDVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  args;
  char *in_stack_ffffffffffffffa8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  in_stack_ffffffffffffffb0;
  
  args.bits = (uintptr_t)in_RDI;
  TaggedPointer((LightHandle *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  bVar1 = std::operator==(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  if (!bVar1) {
    ErrorExit<std::__cxx11::string_const&>
              ((FileLoc *)in_stack_ffffffffffffffb0.bits,in_stack_ffffffffffffffa8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args.bits);
  }
  MediumHandle::MediumHandle(in_RCX,in_stack_ffffffffffffff68);
  ParameterDictionary::ColorSpace(in_RDX);
  ShapeHandle::ShapeHandle((ShapeHandle *)in_RCX,(ShapeHandle *)in_stack_ffffffffffffff68);
  pDVar2 = (DiffuseAreaLight *)&stack0xffffffffffffffa8;
  DiffuseAreaLight::Create
            (in_stack_00000978,in_stack_00000970,in_stack_00000968,in_stack_00000960,
             in_stack_00000958,in_stack_00000980,in_stack_00000990);
  TaggedPointer<pbrt::DiffuseAreaLight>((LightHandle *)in_RCX,pDVar2);
  operator=((LightHandle *)in_RCX,(LightHandle *)pDVar2);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)in_RDI);
  if (!bVar1) {
    ErrorExit<std::__cxx11::string_const&>
              ((FileLoc *)in_stack_00000010.bits,in_stack_ffffffffffffffa8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args.bits);
  }
  ParameterDictionary::ReportUnused(in_stack_00000140);
  return (LightHandle)
         (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          )args.bits;
}

Assistant:

LightHandle LightHandle::CreateArea(const std::string &name,
                                    const ParameterDictionary &parameters,
                                    const Transform &renderFromLight,
                                    const MediumInterface &mediumInterface,
                                    const ShapeHandle shape, const FileLoc *loc,
                                    Allocator alloc) {
    LightHandle area = nullptr;
    if (name == "diffuse")
        area =
            DiffuseAreaLight::Create(renderFromLight, mediumInterface.outside, parameters,
                                     parameters.ColorSpace(), loc, alloc, shape);
    else
        ErrorExit(loc, "%s: area light type unknown.", name);

    if (!area)
        ErrorExit(loc, "%s: unable to create area light.", name);

    parameters.ReportUnused();
    return area;
}